

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O1

uint mem_read(void *handle,char *target,uint size)

{
  void *__src;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = *(ulong *)(*(long *)((long)handle + 0x10) + 0x1b0e0);
  uVar1 = *(uint *)((long)handle + 0xc);
  __src = (void *)(*handle + (ulong)uVar1);
  if ((uVar2 < *handle) &&
     (__src < (void *)(uVar2 + *(uint *)(*(long *)((long)handle + 0x10) + 0x1b0e8) + 0x8000))) {
    *(undefined1 *)((long)handle + 0x18) = 1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = *(uint *)((long)handle + 8) - uVar1;
    if (uVar1 <= *(uint *)((long)handle + 8) && uVar4 != 0) {
      uVar3 = size;
      if (uVar4 < size) {
        uVar3 = uVar4;
      }
      memcpy(target,__src,(ulong)uVar3);
      *(int *)((long)handle + 0xc) = *(int *)((long)handle + 0xc) + uVar3;
    }
  }
  return uVar3;
}

Assistant:

local unsigned mem_read(void* handle, char* target, unsigned size)
{
    BufData* bufdata = (BufData*)handle;

    char* wp = bufdata->zid->out_buf + bufdata->zid->out_offset;
    char* rp = bufdata->in_buf + bufdata->in_offset;

    // This will normally never trigger
    if ((wp + 32768 > rp) && (bufdata->zid->out_buf < bufdata->in_buf)) {
        bufdata->fail = true;
        return 0;
    }

    if (bufdata->in_offset >= bufdata->in_size)
        return 0;
    ulg left = bufdata->in_size - bufdata->in_offset;
    if (left < (ulg)size)
        size = left;
    memcpy(target, rp, size);
    bufdata->in_offset += size;

    return size;
}